

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_get_float_vector
          (exr_const_context_t_conflict ctxt,int part_index,char *name,int32_t *sz,float **out)

{
  exr_result_t eVar1;
  exr_context_t nonc;
  exr_attribute_t *attr;
  exr_attribute_t *local_30;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar1 = 2;
  }
  else {
    if (ctxt->mode == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
    }
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar1 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar1;
    }
    if ((name == (char *)0x0) || (*name == '\0')) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid name for floatvector attribute query");
      return eVar1;
    }
    eVar1 = exr_attr_list_find_by_name
                      (ctxt,&ctxt->parts[(uint)part_index]->attributes,name,&local_30);
    if (eVar1 == 0) {
      if (local_30->type != EXR_ATTR_FLOAT_VECTOR) {
        if (ctxt->mode == '\x01') {
          pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
        }
        eVar1 = (*ctxt->print_error)
                          (ctxt,0x10,
                           "\'%s\' requested type \'floatvector\', but stored attributes is type \'%s\'"
                           ,name,local_30->type_name);
        return eVar1;
      }
      if (sz != (int32_t *)0x0) {
        *sz = (((local_30->field_6).box2i)->min).x;
      }
      if (out != (float **)0x0) {
        *out = (float *)((local_30->field_6).box2i)->max;
      }
      eVar1 = 0;
    }
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_get_float_vector (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    int32_t*            sz,
    const float**       out)
{
    ATTR_FIND_ATTR (EXR_ATTR_FLOAT_VECTOR, floatvector);
    if (sz) *sz = attr->floatvector->length;
    if (out) *out = attr->floatvector->arr;
    return EXR_UNLOCK_WRITE_AND_RETURN (rv);
}